

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void __thiscall djb::tab::compute_cdf(tab *this)

{
  pointer *ppvVar1;
  iterator iVar2;
  pointer pvVar3;
  int iVar4;
  long lVar5;
  int i1;
  long lVar6;
  long lVar7;
  int i2;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float extraout_XMM0_Da;
  float fVar12;
  vec3 wm;
  vec2 local_88;
  float local_80;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  long local_58;
  vec2 local_50;
  long local_48;
  long local_40;
  long local_38;
  
  lVar6 = 4;
  lVar5 = 0;
  do {
    fVar8 = (float)(int)lVar5 * 0.03125;
    fVar8 = (fVar8 + fVar8 + -1.0) * 3.1415927;
    local_48 = lVar5;
    local_40 = lVar6;
    local_74 = cosf(fVar8);
    local_78 = sinf(fVar8);
    lVar5 = 0;
    local_58 = lVar6;
    do {
      fVar8 = (float)(int)lVar5 / 15.0;
      local_38 = lVar5;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      fVar9 = fVar8 * 3.1415927 * 0.5;
      fVar10 = cosf(fVar9);
      fVar8 = 0.0;
      if (0.0 <= fVar10) {
        fVar8 = fVar10;
      }
      fVar9 = sinf(fVar9);
      local_6c = local_74 * fVar9;
      iVar4 = 0x200;
      do {
        local_88.x = 0.0;
        local_88.y = 0.0;
        iVar2._M_current =
             (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<djb::vec2,_std::allocator<djb::vec2>_>::_M_realloc_insert<djb::vec2>
                    (&this->m_cdf,iVar2,&local_88);
        }
        else {
          (iVar2._M_current)->x = 0.0;
          (iVar2._M_current)->y = 0.0;
          ppvVar1 = &(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      local_70 = 1.0;
      if (fVar8 <= 1.0) {
        local_70 = fVar8;
      }
      fVar9 = fVar9 * local_78;
      lVar6 = 1;
      lVar5 = local_58;
      do {
        local_64 = (float)(int)lVar6 * 0.015625;
        fVar8 = local_64 * local_64 * 3.1415927 * 0.5;
        local_68 = cosf(fVar8);
        fVar10 = sinf(fVar8);
        fVar8 = 0.0;
        lVar7 = 0;
        do {
          fVar11 = (float)(int)lVar7 * 0.001953125;
          local_60 = (fVar11 + fVar11 + -1.0) * 3.1415927;
          local_5c = cosf(local_60);
          fVar11 = sinf(local_60);
          local_88.y = fVar11 * fVar10;
          local_88.x = local_5c * fVar10;
          local_80 = local_68;
          (*(this->super_microfacet).super_brdf._vptr_brdf[0xb])(this,&local_88);
          fVar12 = local_80 * local_70 + local_88.x * local_6c + local_88.y * fVar9;
          fVar11 = 0.0;
          if (0.0 <= fVar12) {
            fVar11 = fVar12;
          }
          fVar12 = 1.0;
          if (fVar11 <= 1.0) {
            fVar12 = fVar11;
          }
          pvVar3 = (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar11 = fVar12 * extraout_XMM0_Da * local_64 * fVar10;
          fVar8 = fVar11 + fVar8;
          local_50.x = fVar8 * 0.09817477 * 0.0061359233 +
                       *(float *)((long)pvVar3 + lVar7 * 8 + lVar5 + -4);
          local_50.y = fVar11 * 0.0061359233 + *(float *)((long)&pvVar3[lVar7].x + lVar5);
          iVar2._M_current =
               (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<djb::vec2,_std::allocator<djb::vec2>_>::_M_realloc_insert<djb::vec2>
                      (&this->m_cdf,iVar2,&local_50);
          }
          else {
            *iVar2._M_current = local_50;
            ppvVar1 = &(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppvVar1 = *ppvVar1 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x200);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x1000;
      } while (lVar6 != 0x40);
      lVar5 = local_38 + 1;
      local_58 = local_58 + 0x40000;
    } while (lVar5 != 0x10);
    lVar5 = local_48 + 1;
    lVar6 = local_40 + 0x400000;
  } while (lVar5 != 0x20);
  fwrite("djb_verbose: CDF ready\n",0x17,1,_stdout);
  return;
}

Assistant:

void tab::compute_cdf()
{
	int npi = 32;
	int nti = 16;
	int nu2 = 64;
	int nu1 = 512;
	double du2 = (double)m_pi() / nu1;
	double du1 = 2 * (double)m_pi() / nu2;

	for (int i4 = 0; i4 < npi; ++i4) {
		float_t u = (float_t)i4 / npi;   // in [0,1)
		float_t pi = (2 * u - 1) * m_pi(); // in [-pi,pi)
		float_t cpi = cos(pi), spi = sin(pi);

		for (int i3 = 0; i3 < nti; ++i3) {
			float_t u = (float_t)i3 / (nti - 1); // in [0,1]
			float_t ti = sqrt(u) * m_pi() / 2;     // in [0,pi/2]
			float_t zi = sat(cos(ti)), z_i = sin(ti);
			vec3 wi = vec3(z_i * cpi, z_i * spi, zi);

			// bottom row (zeroes since z_m = 0)
			for (int i1 = 0; i1 < nu1; ++i1)
				m_cdf.push_back(vec2(0));

			// rest of the domain
			for (int i2 = 1; i2 < nu2; ++i2) {
				float_t u2 = (float_t)i2 / nu2;   // in (0,1)
				float_t tm = sqr(u2) * m_pi() / 2;  // in [0,pi/2)
				float_t ctm = cos(tm), stm = sin(tm);
				double nint = 0;

				for (int i1 = 0; i1 < nu1; ++i1) {
					float_t u1 = (float_t)i1 / nu1;    // in [0,1)
					float_t pm = (2 * u1 - 1) * m_pi();  // in [phi_i-pi/2,phi_i+pi/2)
					float_t cpm = cos(pm), spm = sin(pm);
					vec3 wm = vec3(stm * cpm, stm * spm, ctm);
					float_t ndf = ndf_std(wm);
					float_t dp = sat(dot(wm, wi));
					int idx = i1 + nu1 * (i2 - 1 + nu2 * (i3 + nti * i4));
					vec2 nint2 = m_cdf[idx];
					float_t tmp = dp * ndf * u2 * stm;

					nint+= (double)tmp;
					m_cdf.push_back(vec2(nint * du1, tmp) * du2 + nint2);
				}
			}
		}
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: CDF ready\n");
#endif
}